

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_array.h
# Opt level: O0

StorageElement * __thiscall
absl::lts_20250127::FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::Storage::
InitializeData(Storage *this)

{
  bool bVar1;
  size_type sVar2;
  allocator_type *__a;
  Storage *this_local;
  
  sVar2 = size(this);
  bVar1 = UsingInlinedStorage(sVar2);
  if (bVar1) {
    sVar2 = size(this);
    NonEmptyInlinedStorage::AnnotateConstruct((NonEmptyInlinedStorage *)this,sVar2);
    this_local = (Storage *)NonEmptyInlinedStorage::data((NonEmptyInlinedStorage *)this);
  }
  else {
    __a = alloc(this);
    sVar2 = size(this);
    this_local = (Storage *)std::allocator_traits<std::allocator<char>_>::allocate(__a,sVar2);
  }
  return (StorageElement *)this_local;
}

Assistant:

StorageElement* InitializeData() {
      if (UsingInlinedStorage(size())) {
        InlinedStorage::AnnotateConstruct(size());
        return InlinedStorage::data();
      } else {
        return reinterpret_cast<StorageElement*>(
            AllocatorTraits::allocate(alloc(), size()));
      }
    }